

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v128_intrinsics_c.h
# Opt level: O2

int64_t c_v128_dotp_s32(c_v128 a,c_v128 b)

{
  return (long)(int)(a.u32[0] * b.u32[0]) + (long)(int)(a.u32[2] * b.u32[2]) +
         ((long)((b.u64[0] >> 0x20) * (a.u64[0] & 0xffffffff00000000)) >> 0x20) +
         ((long)((b.u64[1] >> 0x20) * (a.u64[1] & 0xffffffff00000000)) >> 0x20);
}

Assistant:

SIMD_INLINE int64_t c_v128_dotp_s32(c_v128 a, c_v128 b) {
  // 32 bit products, 64 bit sum
  return (int64_t)(int32_t)((int64_t)a.s32[3] * b.s32[3]) +
         (int64_t)(int32_t)((int64_t)a.s32[2] * b.s32[2]) +
         (int64_t)(int32_t)((int64_t)a.s32[1] * b.s32[1]) +
         (int64_t)(int32_t)((int64_t)a.s32[0] * b.s32[0]);
}